

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cc
# Opt level: O0

void __thiscall
tchecker::zg::path::concrete::clockval_dbm_t::compute_clock_valuation_from_dbm(clockval_dbm_t *this)

{
  uint uVar1;
  reference n;
  rational<long> *prVar2;
  rational<long> local_50;
  uint local_40;
  clock_id_t id;
  allocator<int> local_2d;
  value_type_conflict3 local_2c;
  undefined1 local_28 [8];
  vector<int,_std::allocator<int>_> clock_values;
  clockval_dbm_t *this_local;
  
  uVar1 = this->_dim;
  local_2c = 0;
  clock_values.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this;
  std::allocator<int>::allocator(&local_2d);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_28,(ulong)uVar1,&local_2c,&local_2d);
  std::allocator<int>::~allocator(&local_2d);
  tchecker::dbm::satisfying_integer_valuation
            (this->_dbm,this->_dim,(vector<int,_std::allocator<int>_> *)local_28);
  for (local_40 = 0; local_40 < this->_dim; local_40 = local_40 + 1) {
    n = std::vector<int,_std::allocator<int>_>::operator[]
                  ((vector<int,_std::allocator<int>_> *)local_28,(ulong)local_40);
    boost::rational<long>::rational<int,int>(&local_50,n,&this->_denominator,(type *)0x0);
    prVar2 = make_array_t<boost::rational<long>,_16UL,_tchecker::clockval_base_t>::operator[]
                       (&this->_clockval->super_clock_value_array_t,(capacity_t_conflict)local_40);
    prVar2->num = local_50.num;
    prVar2->den = local_50.den;
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_28);
  return;
}

Assistant:

void compute_clock_valuation_from_dbm()
  {
    std::vector<tchecker::integer_t> clock_values(_dim, 0);
    tchecker::dbm::satisfying_integer_valuation(_dbm, _dim, clock_values);
    for (tchecker::clock_id_t id = 0; id < _dim; ++id)
      (*_clockval)[id] = tchecker::clock_rational_value_t{clock_values[id], _denominator};
  }